

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Tree::has_sibling(Tree *this,size_t node,size_t sib)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  undefined1 uVar4;
  ulong uVar5;
  NodeData *pNVar6;
  
  uVar5 = this->m_cap;
  if (node == 0xffffffffffffffff || uVar5 <= node) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return (bool)uVar4;
      }
    }
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar5 = this->m_cap;
  }
  pNVar6 = this->m_buf;
  sVar1 = pNVar6[node].m_parent;
  if ((sib == 0xffffffffffffffff) || (uVar5 <= sib)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return (bool)uVar4;
      }
    }
    (*(code *)PTR_error_impl_0023f548)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar6 = this->m_buf;
  }
  return sVar1 == pNVar6[sib].m_parent;
}

Assistant:

bool has_sibling(size_t node, size_t sib) const { return _p(node)->m_parent == _p(sib)->m_parent; }